

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::Iterator<Kernel::Literal*>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  byte bVar1;
  byte bVar2;
  Node *in_RCX;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDX;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_RSI;
  long in_RDI;
  size_t initialCapacity;
  undefined4 in_R8D;
  byte in_R9B;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  undefined6 in_stack_ffffffffffffffd8;
  
  bVar2 = (byte)in_R8D & 1;
  bVar1 = in_R9B & 1;
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::RobUnification
            ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)0x4385bb);
  Lib::Stack<unsigned_int>::Stack
            ((Stack<unsigned_int> *)CONCAT44(in_R8D,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  initialCapacity = in_RDI + 0xf0;
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             0x4385ed);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
  ::Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
           *)CONCAT44(in_R8D,in_stack_ffffffffffffff90),initialCapacity);
  Lib::BacktrackData::BacktrackData((BacktrackData *)(in_RDI + 0x120));
  Lib::Stack<Lib::BacktrackData>::Stack
            ((Stack<Lib::BacktrackData> *)CONCAT44(in_R8D,in_stack_ffffffffffffff90),initialCapacity
            );
  Lib::BacktrackData::BacktrackData((BacktrackData *)(in_RDI + 0x150));
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 0x158));
  init<Kernel::Literal*>
            (in_RSI,in_RDX,in_RCX,
             (Literal *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd8)),
             (bool)in_stack_ffffffffffffffd7,(bool)in_stack_ffffffffffffffd6);
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }